

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=(Fad<double> *this,FadExpr<FadFuncSin<Fad<double>_>_> *fadexpr)

{
  uint ssize;
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  value_type vVar5;
  double dVar6;
  
  ssize = (fadexpr->fadexpr_).expr_.dx_.num_elts;
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
  }
  if (ssize != 0) {
    pdVar1 = (this->dx_).ptr_to_data;
    if ((fadexpr->fadexpr_).expr_.dx_.num_elts == 0) {
      uVar2 = 0;
      uVar3 = (ulong)ssize;
      if ((int)ssize < 1) {
        uVar3 = uVar2;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        vVar5 = FadFuncSin<Fad<double>_>::dx(&fadexpr->fadexpr_,(int)uVar2);
        pdVar1[uVar2] = vVar5;
      }
    }
    else {
      uVar2 = 0;
      uVar3 = (ulong)ssize;
      if ((int)ssize < 1) {
        uVar3 = uVar2;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        dVar6 = (fadexpr->fadexpr_).expr_.dx_.ptr_to_data[uVar2];
        dVar4 = cos((fadexpr->fadexpr_).expr_.val_);
        pdVar1[uVar2] = dVar4 * dVar6;
      }
    }
  }
  dVar6 = sin((fadexpr->fadexpr_).expr_.val_);
  this->val_ = dVar6;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}